

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O3

void __thiscall OjaNewton::update_A(OjaNewton *this)

{
  float *pfVar1;
  bool bVar2;
  ulong uVar3;
  int k;
  ulong uVar4;
  int j;
  long lVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  if (0 < this->m) {
    lVar6 = 2;
    uVar7 = 1;
    do {
      if (1 < uVar7) {
        uVar3 = 1;
        do {
          this->zv[uVar3] = 0.0;
          uVar4 = 0;
          do {
            this->zv[uVar3] =
                 this->A[uVar7][uVar4 + 1] * this->K[uVar4 + 1][uVar3] + this->zv[uVar3];
            uVar4 = uVar4 + 1;
          } while (uVar7 != uVar4);
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar7);
        if (1 < uVar7) {
          uVar3 = 1;
          do {
            this->vv[uVar3] = 0.0;
            uVar4 = 0;
            do {
              this->vv[uVar3] = this->A[uVar3][uVar4 + 1] * this->zv[uVar4 + 1] + this->vv[uVar3];
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
            uVar3 = uVar3 + 1;
          } while (uVar3 != uVar7);
          if (1 < uVar7) {
            uVar4 = 1;
            uVar3 = uVar4;
            do {
              do {
                pfVar1 = this->A[uVar7];
                pfVar1[uVar3] = pfVar1[uVar3] - this->vv[uVar4] * this->A[uVar4][uVar3];
                uVar4 = uVar4 + 1;
              } while (uVar4 < uVar7);
              uVar4 = uVar3 + 1;
              uVar3 = uVar4;
            } while (uVar4 != uVar7);
          }
        }
      }
      fVar8 = 0.0;
      lVar5 = 1;
      do {
        uVar3 = 0;
        fVar9 = 0.0;
        do {
          fVar9 = fVar9 + this->K[lVar5][uVar3 + 1] * this->A[uVar7][uVar3 + 1];
          uVar3 = uVar3 + 1;
        } while (uVar7 != uVar3);
        fVar8 = fVar8 + fVar9 * this->A[uVar7][lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != lVar6);
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      uVar3 = 0;
      do {
        this->A[uVar7][uVar3 + 1] = this->A[uVar7][uVar3 + 1] / fVar8;
        uVar3 = uVar3 + 1;
      } while (uVar7 != uVar3);
      lVar6 = lVar6 + 1;
      bVar2 = (long)uVar7 < (long)this->m;
      uVar7 = uVar7 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void update_A()
  {
    for (int i = 1; i <= m; i++)
    {
      for (int j = 1; j < i; j++)
      {
        zv[j] = 0;
        for (int k = 1; k <= i; k++)
        {
          zv[j] += A[i][k] * K[k][j];
        }
      }

      for (int j = 1; j < i; j++)
      {
        vv[j] = 0;
        for (int k = 1; k <= j; k++)
        {
          vv[j] += A[j][k] * zv[k];
        }
      }

      for (int j = 1; j < i; j++)
      {
        for (int k = j; k < i; k++)
        {
          A[i][j] -= vv[k] * A[k][j];
        }
      }

      float norm = 0;
      for (int j = 1; j <= i; j++)
      {
        float temp = 0;
        for (int k = 1; k <= i; k++)
        {
          temp += K[j][k] * A[i][k];
        }
        norm += A[i][j] * temp;
      }
      norm = sqrtf(norm);

      for (int j = 1; j <= i; j++)
      {
        A[i][j] /= norm;
      }
    }
  }